

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsItemEffectSourcePrivate::boundingRect
          (QRectF *__return_storage_ptr__,QGraphicsItemEffectSourcePrivate *this,
          CoordinateSystem system)

{
  long in_FS_OFFSET;
  qreal qVar1;
  qreal qVar2;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((system == DeviceCoordinates) && (this->info == (QGraphicsItemPaintInfo *)0x0)) {
    local_48.xp._0_4_ = 2;
    local_48.w._4_4_ = 0;
    local_48.xp._4_4_ = 0;
    local_48.yp = 0.0;
    local_48.w._0_4_ = 0;
    local_48.h = 3.05543930413181e-317;
    QMessageLogger::warning
              ((char *)&local_48,
               "QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context");
    qVar1 = 0.0;
    qVar2 = 0.0;
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
  }
  else {
    *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
    (*this->item->_vptr_QGraphicsItem[3])(__return_storage_ptr__);
    if ((((this->item->d_ptr).d)->children).d.size != 0) {
      QGraphicsItem::childrenBoundingRect(&local_48,this->item);
      QRectF::operator|=(__return_storage_ptr__,&local_48);
    }
    if (system != DeviceCoordinates) goto LAB_0057f5c9;
    QPainter::worldTransform();
    QTransform::mapRect((QRectF *)&local_48);
    qVar1 = (qreal)CONCAT44(local_48.xp._4_4_,local_48.xp._0_4_);
    __return_storage_ptr__->w = (qreal)CONCAT44(local_48.w._4_4_,local_48.w._0_4_);
    __return_storage_ptr__->h = local_48.h;
    qVar2 = local_48.yp;
  }
  __return_storage_ptr__->xp = qVar1;
  __return_storage_ptr__->yp = qVar2;
LAB_0057f5c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItemEffectSourcePrivate::boundingRect(Qt::CoordinateSystem system) const
{
    const bool deviceCoordinates = (system == Qt::DeviceCoordinates);
    if (!info && deviceCoordinates) {
        // Device coordinates without info not yet supported.
        qWarning("QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context");
        return QRectF();
    }

    QRectF rect = item->boundingRect();
    if (!item->d_ptr->children.isEmpty())
        rect |= item->childrenBoundingRect();

    if (deviceCoordinates) {
        Q_ASSERT(info->painter);
        rect = info->painter->worldTransform().mapRect(rect);
    }

    return rect;
}